

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O3

void __thiscall Personality::PrintPersonality(Personality *this)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  _Self __tmp;
  _List_node_base *p_Var5;
  _Self __tmp_1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->cost);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Personality Type: ",0x12);
  switch(this->typeP) {
  case ATTACKER:
    pcVar4 = "Attacker";
    break;
  case DEFENDER:
    pcVar4 = "Defender";
    break;
  case SHOGUN:
    pcVar4 = "Shogun";
    lVar3 = 6;
    goto LAB_0010bb6a;
  case CHANCELLOR:
    pcVar4 = "Chancellor";
    lVar3 = 10;
    goto LAB_0010bb6a;
  case CHAMPION:
    pcVar4 = "Champion";
    break;
  default:
    return;
  }
  lVar3 = 8;
LAB_0010bb6a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->tapped == true) {
    pcVar4 = "Tapped: yes";
    lVar3 = 0xb;
  }
  else {
    pcVar4 = "Tapped: no";
    lVar3 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->revealed == true) {
    pcVar4 = "Revealed: yes";
    lVar3 = 0xd;
  }
  else {
    pcVar4 = "Revealed: no";
    lVar3 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Attack: ",8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->attack);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Defense: ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->defense);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Honour: ",8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->honour);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Maximum possible followers: ",0x1c);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->maxFollowers);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  p_Var5 = (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)&this->followers) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No followers",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  else {
    do {
      Follower::PrintFollower((Follower *)p_Var5[1]._M_next);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)&this->followers);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Maximum possible items: ",0x18);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->maxItems);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  p_Var5 = (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)&this->items) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No followers",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  else {
    do {
      Item::PrintItem((Item *)p_Var5[1]._M_next);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)&this->items);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void Personality::PrintPersonality()                                //prints personality's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Personality Type: ";
    if (typeP == ATTACKER)
        cout << "Attacker" << endl;
    else if (typeP == DEFENDER)
        cout << "Defender" << endl;
    else if (typeP == SHOGUN)
        cout << "Shogun" << endl;
    else if (typeP == CHANCELLOR)
        cout << "Chancellor" << endl;
    else if (typeP == CHAMPION)
        cout << "Champion" << endl;
    else
        return;

    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Attack: " << attack << endl;
    cout << "Defense: " << defense << endl;
    cout << "Honour: " << honour << endl;

    cout << "Maximum possible followers: " << maxFollowers << endl;

    list<Follower*>::iterator itf;

    if (followers.empty())
        cout << "No followers" << endl;
    else
    {
        for (itf=followers.begin(); itf!=followers.end(); itf++)
            (*itf)->PrintFollower();
    }

    cout << "Maximum possible items: " << maxItems << endl;

    list<Item*>::iterator iti;

    if (items.empty())
        cout << "No followers" << endl;
    else
    {
        for (iti=items.begin(); iti!=items.end(); iti++)
            (*iti)->PrintItem();
    }
    cout << endl;
}